

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_list.h
# Opt level: O2

iterator __thiscall spvtools::opt::InstructionList::iterator::Erase(iterator *this)

{
  Instruction *pIVar1;
  long *in_RSI;
  
  pIVar1 = ((IntrusiveNodeBase<spvtools::opt::Instruction> *)*in_RSI)->next_node_;
  utils::IntrusiveNodeBase<spvtools::opt::Instruction>::RemoveFromList
            ((IntrusiveNodeBase<spvtools::opt::Instruction> *)*in_RSI);
  if ((long *)*in_RSI != (long *)0x0) {
    (**(code **)(*(long *)*in_RSI + 8))();
  }
  (this->super_iterator).node_ = pIVar1;
  return (iterator)(iterator)this;
}

Assistant:

iterator Erase() {
      iterator_template next_node = *this;
      ++next_node;
      node_->RemoveFromList();
      delete node_;
      return next_node;
    }